

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.h
# Opt level: O0

SpotLight * embree::SceneGraph::SpotLight::lerp(SpotLight *light0,SpotLight *light1,float f)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  long in_RDX;
  long in_RSI;
  SpotLight *in_RDI;
  float in_XMM0_Da;
  undefined8 local_6b8;
  undefined8 uStack_6b0;
  undefined8 local_688;
  undefined8 uStack_680;
  undefined8 *local_670;
  undefined8 *local_668;
  undefined1 *local_660;
  undefined8 local_658;
  undefined8 uStack_650;
  undefined8 *local_640;
  undefined8 *local_638;
  undefined1 *local_630;
  undefined8 local_628;
  undefined8 uStack_620;
  undefined8 *local_610;
  undefined8 *local_608;
  undefined8 *local_600;
  undefined8 local_5f8;
  undefined8 uStack_5f0;
  undefined8 *local_5e8;
  undefined8 *local_5e0;
  float local_5d4;
  undefined8 *local_5d0;
  float local_5c4;
  undefined8 *local_5c0;
  undefined8 local_5b8;
  undefined8 uStack_5b0;
  undefined8 *local_5a0;
  undefined8 *local_598;
  undefined8 *local_590;
  undefined8 *local_588;
  undefined8 *local_580;
  undefined8 *local_578;
  undefined8 *local_570;
  float local_568;
  float fStack_564;
  float fStack_560;
  float fStack_55c;
  undefined8 *local_558;
  undefined8 *local_550;
  undefined8 *local_548;
  undefined8 *local_540;
  float local_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  undefined8 *local_520;
  undefined8 local_518;
  undefined8 uStack_510;
  undefined8 local_508;
  undefined8 uStack_500;
  float local_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float local_4dc;
  float local_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  undefined8 *local_4a8;
  undefined8 *local_4a0;
  float local_494;
  undefined1 *local_490;
  float local_484;
  undefined8 *local_480;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined8 *local_460;
  undefined8 *local_458;
  undefined8 *local_450;
  undefined1 *local_448;
  undefined8 *local_440;
  undefined8 *local_438;
  undefined1 *local_430;
  float local_428;
  float fStack_424;
  float fStack_420;
  float fStack_41c;
  undefined1 *local_418;
  undefined8 *local_410;
  undefined8 *local_408;
  undefined8 *local_400;
  float local_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  undefined8 *local_3e0;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  float local_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float local_39c;
  float local_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  undefined8 local_388;
  undefined8 uStack_380;
  undefined8 local_378;
  undefined8 uStack_370;
  undefined8 *local_368;
  undefined8 *local_360;
  float local_354;
  undefined1 *local_350;
  float local_344;
  undefined8 *local_340;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined8 *local_320;
  undefined8 *local_318;
  undefined8 *local_310;
  undefined1 *local_308;
  undefined8 *local_300;
  undefined8 *local_2f8;
  undefined1 *local_2f0;
  float local_2e8;
  float fStack_2e4;
  float fStack_2e0;
  float fStack_2dc;
  undefined1 *local_2d8;
  undefined8 *local_2d0;
  undefined8 *local_2c8;
  undefined8 *local_2c0;
  float local_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  undefined8 *local_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  float local_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float local_268;
  float local_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined1 local_238 [16];
  undefined8 *local_228;
  undefined8 *local_218;
  undefined1 *local_208;
  undefined8 *local_200;
  undefined1 *local_1f8;
  undefined8 *local_1f0;
  float local_1e8;
  float fStack_1e4;
  float fStack_1e0;
  float fStack_1dc;
  undefined8 *local_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined1 local_188 [16];
  undefined8 *local_178;
  undefined8 *local_168;
  undefined1 *local_158;
  undefined8 *local_150;
  undefined1 *local_148;
  undefined8 *local_140;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  undefined8 *local_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined1 local_d8 [16];
  undefined8 *local_c8;
  undefined8 *local_b8;
  undefined1 *local_a8;
  undefined8 *local_a0;
  undefined1 *local_98;
  undefined8 *local_90;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  undefined8 *local_70;
  undefined8 local_68;
  undefined8 uStack_60;
  float local_2c;
  undefined4 local_28;
  float local_24;
  undefined4 local_20;
  float local_1c;
  float local_14;
  undefined4 local_10;
  float local_c;
  undefined4 local_8;
  float local_4;
  
  local_608 = (undefined8 *)(in_RSI + 0x10);
  local_610 = (undefined8 *)(in_RDX + 0x10);
  local_600 = &local_6b8;
  local_5d4 = 1.0 - in_XMM0_Da;
  local_5e8 = &local_628;
  local_208 = local_238;
  uVar1 = *local_610;
  uVar2 = *(undefined8 *)(in_RDX + 0x18);
  local_1c8._0_4_ = (float)uVar1;
  local_1c8._4_4_ = (float)((ulong)uVar1 >> 0x20);
  uStack_1c0._0_4_ = (float)uVar2;
  uStack_1c0._4_4_ = (float)((ulong)uVar2 >> 0x20);
  local_1e8 = in_XMM0_Da * (float)local_1c8;
  fStack_1e4 = in_XMM0_Da * local_1c8._4_4_;
  fStack_1e0 = in_XMM0_Da * (float)uStack_1c0;
  fStack_1dc = in_XMM0_Da * uStack_1c0._4_4_;
  local_5c0 = &local_5f8;
  local_508 = CONCAT44(local_5d4,local_5d4);
  uStack_500 = CONCAT44(local_5d4,local_5d4);
  local_578 = &local_5b8;
  uVar3 = *local_608;
  uVar4 = *(undefined8 *)(in_RSI + 0x18);
  local_518._0_4_ = (float)uVar3;
  local_518._4_4_ = (float)((ulong)uVar3 >> 0x20);
  uStack_510._0_4_ = (float)uVar4;
  uStack_510._4_4_ = (float)((ulong)uVar4 >> 0x20);
  local_538 = local_5d4 * (float)local_518;
  fStack_534 = local_5d4 * local_518._4_4_;
  fStack_530 = local_5d4 * (float)uStack_510;
  fStack_52c = local_5d4 * uStack_510._4_4_;
  local_4c8 = CONCAT44(fStack_534,local_538);
  uStack_4c0 = CONCAT44(fStack_52c,fStack_530);
  local_4d8 = (float)local_628;
  fStack_4d4 = (float)((ulong)local_628 >> 0x20);
  fStack_4d0 = (float)uStack_620;
  fStack_4cc = (float)((ulong)uStack_620 >> 0x20);
  local_568 = local_538 + local_4d8;
  fStack_564 = fStack_534 + fStack_4d4;
  fStack_560 = fStack_530 + fStack_4d0;
  fStack_55c = fStack_52c + fStack_4cc;
  local_6b8 = CONCAT44(fStack_564,local_568);
  uStack_6b0 = CONCAT44(fStack_55c,fStack_560);
  local_638 = (undefined8 *)(in_RSI + 0x20);
  local_640 = (undefined8 *)(in_RDX + 0x20);
  local_630 = &stack0xfffffffffffff938;
  local_494 = 1.0 - in_XMM0_Da;
  local_4a8 = &local_658;
  local_158 = local_188;
  uVar5 = *local_640;
  uVar6 = *(undefined8 *)(in_RDX + 0x28);
  local_118._0_4_ = (float)uVar5;
  local_118._4_4_ = (float)((ulong)uVar5 >> 0x20);
  uStack_110._0_4_ = (float)uVar6;
  uStack_110._4_4_ = (float)((ulong)uVar6 >> 0x20);
  local_138 = in_XMM0_Da * (float)local_118;
  fStack_134 = in_XMM0_Da * local_118._4_4_;
  fStack_130 = in_XMM0_Da * (float)uStack_110;
  fStack_12c = in_XMM0_Da * uStack_110._4_4_;
  local_480 = &local_4b8;
  local_3c8 = CONCAT44(local_494,local_494);
  uStack_3c0 = CONCAT44(local_494,local_494);
  local_438 = &local_478;
  uVar7 = *local_638;
  uVar8 = *(undefined8 *)(in_RSI + 0x28);
  local_3d8._0_4_ = (float)uVar7;
  local_3d8._4_4_ = (float)((ulong)uVar7 >> 0x20);
  uStack_3d0._0_4_ = (float)uVar8;
  uStack_3d0._4_4_ = (float)((ulong)uVar8 >> 0x20);
  local_3f8 = local_494 * (float)local_3d8;
  fStack_3f4 = local_494 * local_3d8._4_4_;
  fStack_3f0 = local_494 * (float)uStack_3d0;
  fStack_3ec = local_494 * uStack_3d0._4_4_;
  local_388 = CONCAT44(fStack_3f4,local_3f8);
  uStack_380 = CONCAT44(fStack_3ec,fStack_3f0);
  local_398 = (float)local_658;
  fStack_394 = (float)((ulong)local_658 >> 0x20);
  fStack_390 = (float)uStack_650;
  fStack_38c = (float)((ulong)uStack_650 >> 0x20);
  local_428 = local_3f8 + local_398;
  fStack_424 = fStack_3f4 + fStack_394;
  fStack_420 = fStack_3f0 + fStack_390;
  fStack_41c = fStack_3ec + fStack_38c;
  local_668 = (undefined8 *)(in_RSI + 0x30);
  local_670 = (undefined8 *)(in_RDX + 0x30);
  local_660 = &stack0xfffffffffffff928;
  local_354 = 1.0 - in_XMM0_Da;
  local_368 = &local_688;
  local_a8 = local_d8;
  uVar9 = *local_670;
  uVar10 = *(undefined8 *)(in_RDX + 0x38);
  local_68._0_4_ = (float)uVar9;
  local_68._4_4_ = (float)((ulong)uVar9 >> 0x20);
  uStack_60._0_4_ = (float)uVar10;
  uStack_60._4_4_ = (float)((ulong)uVar10 >> 0x20);
  local_88 = in_XMM0_Da * (float)local_68;
  fStack_84 = in_XMM0_Da * local_68._4_4_;
  fStack_80 = in_XMM0_Da * (float)uStack_60;
  fStack_7c = in_XMM0_Da * uStack_60._4_4_;
  local_340 = &local_378;
  local_288 = CONCAT44(local_354,local_354);
  uStack_280 = CONCAT44(local_354,local_354);
  local_308 = &stack0xfffffffffffff928;
  local_310 = &local_378;
  local_2c0 = &local_338;
  uVar11 = *local_668;
  uVar12 = *(undefined8 *)(in_RSI + 0x38);
  local_298._0_4_ = (float)uVar11;
  local_298._4_4_ = (float)((ulong)uVar11 >> 0x20);
  uStack_290._0_4_ = (float)uVar12;
  uStack_290._4_4_ = (float)((ulong)uVar12 >> 0x20);
  local_2b8 = local_354 * (float)local_298;
  fStack_2b4 = local_354 * local_298._4_4_;
  fStack_2b0 = local_354 * (float)uStack_290;
  fStack_2ac = local_354 * uStack_290._4_4_;
  local_2a0 = &local_338;
  local_248 = CONCAT44(fStack_2b4,local_2b8);
  uStack_240 = CONCAT44(fStack_2ac,fStack_2b0);
  local_2f0 = &stack0xfffffffffffff928;
  local_2f8 = &local_338;
  local_258 = (float)local_688;
  fStack_254 = (float)((ulong)local_688 >> 0x20);
  fStack_250 = (float)uStack_680;
  fStack_24c = (float)((ulong)uStack_680 >> 0x20);
  local_2e8 = local_2b8 + local_258;
  fStack_2e4 = fStack_2b4 + fStack_254;
  fStack_2e0 = fStack_2b0 + fStack_250;
  fStack_2dc = fStack_2ac + fStack_24c;
  local_2d8 = &stack0xfffffffffffff928;
  local_10 = *(undefined4 *)(in_RSI + 0x40);
  local_14 = *(float *)(in_RDX + 0x40);
  local_4 = 1.0 - in_XMM0_Da;
  local_c = in_XMM0_Da * local_14;
  local_28 = *(undefined4 *)(in_RSI + 0x44);
  local_2c = *(float *)(in_RDX + 0x44);
  local_1c = 1.0 - in_XMM0_Da;
  local_24 = in_XMM0_Da * local_2c;
  local_5e0 = local_608;
  local_5d0 = local_600;
  local_5c4 = local_5d4;
  local_5a0 = local_5e8;
  local_598 = local_608;
  local_590 = local_5c0;
  local_588 = local_600;
  local_580 = local_5e8;
  local_570 = local_600;
  local_558 = local_600;
  local_550 = local_608;
  local_548 = local_5c0;
  local_540 = local_578;
  local_520 = local_578;
  local_518 = uVar3;
  uStack_510 = uVar4;
  local_4f8 = local_5d4;
  fStack_4f4 = local_5d4;
  fStack_4f0 = local_5d4;
  fStack_4ec = local_5d4;
  local_4dc = local_5d4;
  local_4a0 = local_638;
  local_490 = local_630;
  local_484 = local_494;
  local_460 = local_4a8;
  local_458 = local_638;
  local_450 = local_480;
  local_448 = local_630;
  local_440 = local_4a8;
  local_430 = local_630;
  local_418 = local_630;
  local_410 = local_638;
  local_408 = local_480;
  local_400 = local_438;
  local_3e0 = local_438;
  local_3d8 = uVar7;
  uStack_3d0 = uVar8;
  local_3b8 = local_494;
  fStack_3b4 = local_494;
  fStack_3b0 = local_494;
  fStack_3ac = local_494;
  local_39c = local_494;
  local_360 = local_668;
  local_350 = local_660;
  local_344 = local_354;
  local_320 = local_368;
  local_318 = local_668;
  local_300 = local_368;
  local_2d0 = local_668;
  local_2c8 = local_310;
  local_298 = uVar11;
  uStack_290 = uVar12;
  local_278 = local_354;
  fStack_274 = local_354;
  fStack_270 = local_354;
  fStack_26c = local_354;
  local_268 = local_354;
  local_228 = local_610;
  local_218 = local_5e8;
  local_200 = local_610;
  local_1f8 = local_208;
  local_1f0 = local_5e8;
  local_1d0 = local_5e8;
  local_1c8 = uVar1;
  uStack_1c0 = uVar2;
  local_178 = local_640;
  local_168 = local_4a8;
  local_150 = local_640;
  local_148 = local_158;
  local_140 = local_4a8;
  local_120 = local_4a8;
  local_118 = uVar5;
  uStack_110 = uVar6;
  local_c8 = local_670;
  local_b8 = local_368;
  local_a0 = local_670;
  local_98 = local_a8;
  local_90 = local_368;
  local_70 = local_368;
  local_68 = uVar9;
  uStack_60 = uVar10;
  local_20 = local_28;
  local_8 = local_10;
  local_688 = CONCAT44(fStack_84,local_88);
  uStack_680 = CONCAT44(fStack_7c,fStack_80);
  local_658 = CONCAT44(fStack_134,local_138);
  uStack_650 = CONCAT44(fStack_12c,fStack_130);
  local_628 = CONCAT44(fStack_1e4,local_1e8);
  uStack_620 = CONCAT44(fStack_1dc,fStack_1e0);
  local_5f8 = local_508;
  uStack_5f0 = uStack_500;
  local_5b8 = local_4c8;
  uStack_5b0 = uStack_4c0;
  local_4b8 = local_3c8;
  uStack_4b0 = uStack_3c0;
  local_478 = local_388;
  uStack_470 = uStack_380;
  local_378 = local_288;
  uStack_370 = uStack_280;
  local_338 = local_248;
  uStack_330 = uStack_240;
  SpotLight((SpotLight *)CONCAT44(fStack_41c,fStack_420),(Vec3fa *)CONCAT44(fStack_424,local_428),
            (Vec3fa *)CONCAT44(fStack_2dc,fStack_2e0),(Vec3fa *)CONCAT44(fStack_2e4,local_2e8),
            (float)((ulong)in_RDI >> 0x20),SUB84(in_RDI,0));
  return in_RDI;
}

Assistant:

static SpotLight lerp(const SpotLight& light0, const SpotLight& light1, const float f)
      {
        return SpotLight(embree::lerp(light0.P,light1.P,f),
                         embree::lerp(light0.D,light1.D,f),
                         embree::lerp(light0.I,light1.I,f),
                         embree::lerp(light0.angleMin,light1.angleMin,f),
                         embree::lerp(light0.angleMax,light1.angleMax,f));
      }